

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

slot_type * __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
::slot_array(raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
             *this)

{
  bool bVar1;
  CommonFields *this_00;
  slot_type *psVar2;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<long>,_absl::lts_20240722::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  *this_local;
  
  bVar1 = is_soo(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf78,
                  "slot_type *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<long>, absl::hash_internal::Hash<long>, std::equal_to<long>, std::allocator<long>>::slot_array() const [Policy = absl::container_internal::FlatHashSetPolicy<long>, Hash = absl::hash_internal::Hash<long>, Eq = std::equal_to<long>, Alloc = std::allocator<long>]"
                 );
  }
  this_00 = common(this);
  psVar2 = (slot_type *)CommonFields::slot_array(this_00);
  return psVar2;
}

Assistant:

slot_type* slot_array() const {
    assert(!is_soo());
    return static_cast<slot_type*>(common().slot_array());
  }